

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

int glfwInit(void)

{
  int iVar1;
  GLFWbool GVar2;
  int iVar3;
  _GLFWmutex *in_RAX;
  int i;
  char *in_stack_00000518;
  
  if (_glfw.initialized == 0) {
    memset(&_glfw,0,0x21458);
    _glfw.hints.init.hatButtons = _glfwInitHints.hatButtons;
    _glfw.hints.init.angleType = _glfwInitHints.angleType;
    _glfw.hints.init.ns = _glfwInitHints.ns;
    iVar1 = _glfwPlatformInit();
    if (iVar1 == 0) {
      terminate();
      iVar1 = 0;
    }
    else {
      GVar2 = _glfwPlatformCreateMutex(in_RAX);
      if (((GVar2 != 0) && (GVar2 = _glfwPlatformCreateTls((_GLFWtls *)in_RAX), GVar2 != 0)) &&
         (GVar2 = _glfwPlatformCreateTls((_GLFWtls *)in_RAX), GVar2 != 0)) {
        _glfwPlatformSetTls(_i,in_RAX);
        _glfw.initialized = 1;
        _glfw.timer.offset = _glfwPlatformGetTimerValue();
        glfwDefaultWindowHints();
        iVar1 = 0;
        while( true ) {
          if (_glfwDefaultMappings[iVar1] == (char *)0x0) {
            return 1;
          }
          iVar3 = glfwUpdateGamepadMappings(in_stack_00000518);
          if (iVar3 == 0) break;
          iVar1 = iVar1 + 1;
        }
        terminate();
        return 0;
      }
      terminate();
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

GLFWAPI int glfwInit(void)
{
    if (_glfw.initialized)
        return GLFW_TRUE;

    memset(&_glfw, 0, sizeof(_glfw));
    _glfw.hints.init = _glfwInitHints;

    if (!_glfwPlatformInit())
    {
        terminate();
        return GLFW_FALSE;
    }

    if (!_glfwPlatformCreateMutex(&_glfw.errorLock) ||
        !_glfwPlatformCreateTls(&_glfw.errorSlot) ||
        !_glfwPlatformCreateTls(&_glfw.contextSlot))
    {
        terminate();
        return GLFW_FALSE;
    }

    _glfwPlatformSetTls(&_glfw.errorSlot, &_glfwMainThreadError);

    _glfw.initialized = GLFW_TRUE;
    _glfw.timer.offset = _glfwPlatformGetTimerValue();

    glfwDefaultWindowHints();

    {
        int i;

        for (i = 0;  _glfwDefaultMappings[i];  i++)
        {
            if (!glfwUpdateGamepadMappings(_glfwDefaultMappings[i]))
            {
                terminate();
                return GLFW_FALSE;
            }
        }
    }

    return GLFW_TRUE;
}